

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Threads.cpp
# Opt level: O3

bool __thiscall
dg::pta::LLVMPointerGraphBuilder::addFunctionToFork
          (LLVMPointerGraphBuilder *this,PSNode *function,PSNodeFork *forkNode)

{
  CallInst *CI;
  Function *F;
  PointerSubgraph *pPVar1;
  PSNode *local_38;
  
  CI = (CallInst *)(forkNode->callInstruction->super_SubgraphNode<dg::pta::PSNode>).user_data;
  F = (Function *)(function->super_SubgraphNode<dg::pta::PSNode>).user_data;
  pPVar1 = createOrGetSubgraph(this,F);
  addInterproceduralPthreadOperands(this,F,CI);
  SubgraphNode<dg::pta::PSNode>::addSuccessor
            (&(forkNode->super_PSNode).super_SubgraphNode<dg::pta::PSNode>,pPVar1->root);
  local_38 = function;
  std::
  _Rb_tree<dg::pta::PSNode*,dg::pta::PSNode*,std::_Identity<dg::pta::PSNode*>,std::less<dg::pta::PSNode*>,std::allocator<dg::pta::PSNode*>>
  ::_M_insert_unique<dg::pta::PSNode*const&>
            ((_Rb_tree<dg::pta::PSNode*,dg::pta::PSNode*,std::_Identity<dg::pta::PSNode*>,std::less<dg::pta::PSNode*>,std::allocator<dg::pta::PSNode*>>
              *)&forkNode->functions_,&local_38);
  return true;
}

Assistant:

bool LLVMPointerGraphBuilder::addFunctionToFork(PSNode *function,
                                                PSNodeFork *forkNode) {
    const llvm::CallInst *CInst =
            forkNode->callInst()->getUserData<llvm::CallInst>();
    const llvm::Function *F = function->getUserData<llvm::Function>();

    DBG(pta,
        "Function '" << F->getName().str() << "' can be spawned via thread");

    PointerSubgraph &subgraph = createOrGetSubgraph(F);
    addInterproceduralPthreadOperands(F, CInst);
    // FIXME: create fork and join edges
    forkNode->addSuccessor(subgraph.root);
    forkNode->addFunction(function);

    return true;
}